

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cyclichash.h
# Opt level: O0

uint __thiscall
CyclicHash<unsigned_int,unsigned_char>::
hash<std::deque<unsigned_char,std::allocator<unsigned_char>>>
          (CyclicHash<unsigned_int,unsigned_char> *this,
          deque<unsigned_char,_std::allocator<unsigned_char>_> *c)

{
  size_type sVar1;
  byte *pbVar2;
  uint local_20;
  uint local_1c;
  uint k;
  uint answer;
  deque<unsigned_char,_std::allocator<unsigned_char>_> *c_local;
  CyclicHash<unsigned_int,_unsigned_char> *this_local;
  
  local_1c = 0;
  local_20 = 0;
  _k = c;
  c_local = (deque<unsigned_char,_std::allocator<unsigned_char>_> *)this;
  while( true ) {
    sVar1 = std::deque<unsigned_char,_std::allocator<unsigned_char>_>::size(_k);
    if (sVar1 <= local_20) break;
    CyclicHash<unsigned_int,_unsigned_char>::fastleftshift1
              ((CyclicHash<unsigned_int,_unsigned_char> *)this,&local_1c);
    pbVar2 = std::deque<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (_k,(ulong)local_20);
    local_1c = *(uint *)(this + (ulong)*pbVar2 * 4 + 0xc) ^ local_1c;
    local_20 = local_20 + 1;
  }
  return local_1c;
}

Assistant:

hashvaluetype hash(container &c) {
    hashvaluetype answer(0);
    for (uint k = 0; k < c.size(); ++k) {
      fastleftshift1(answer);
      answer ^= hasher.hashvalues[static_cast<unsigned int>(c[k])];
    }
    return answer;
  }